

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuples.h
# Opt level: O1

void __thiscall
chrono::ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZROTnodes>::
Update_auxiliary(ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZROTnodes>
                 *this)

{
  double *g_i;
  double dVar1;
  
  g_i = &(this->super_ChConstraint).g_i;
  (this->super_ChConstraint).g_i = 0.0;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::Update_auxiliary
            (&this->tuple_a,g_i);
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>::Update_auxiliary
            (&this->tuple_b,g_i);
  dVar1 = (this->super_ChConstraint).cfm_i;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    *g_i = dVar1 + *g_i;
  }
  return;
}

Assistant:

virtual void Update_auxiliary() override {
        g_i = 0;
        tuple_a.Update_auxiliary(g_i);
        tuple_b.Update_auxiliary(g_i);
        //  adds the constraint force mixing term (usually zero):
        if (cfm_i != 0)
            g_i += cfm_i;
    }